

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSExporter.cpp
# Opt level: O1

int __thiscall
Assimp::Discreet3DSExporter::WriteHierarchy
          (Discreet3DSExporter *this,aiNode *node,int seq,int sibling_level)

{
  StreamWriterLE *this_00;
  uint uVar1;
  uint uVar2;
  aiMesh *this_01;
  StreamWriter<false,_false> *pSVar3;
  ulong uVar4;
  short sVar5;
  aiNode *in_R8;
  ChunkWriter chunk_1;
  ChunkWriter chunk;
  ChunkWriter chunk_3;
  ChunkWriter local_90;
  uint local_80;
  uint local_7c;
  StreamWriter<false,_false> *local_78;
  string local_70;
  ulong local_50;
  aiNode *local_48;
  ChunkWriter local_40;
  
  this_00 = &this->writer;
  local_70._M_string_length = (this->writer).cursor;
  local_70._M_dataplus._M_p = (pointer)this_00;
  StreamWriter<false,_false>::Put<unsigned_short>(this_00,0xb002);
  StreamWriter<false,_false>::Put<unsigned_int>(this_00,0xdeadbeef);
  local_90.chunk_start_pos = (this->writer).cursor;
  local_90.writer = this_00;
  StreamWriter<false,_false>::Put<unsigned_short>(this_00,0xb010);
  StreamWriter<false,_false>::Put<unsigned_int>(this_00,0xdeadbeef);
  WriteString(this,&node->mName);
  StreamWriter<false,_false>::Put<int>(this_00,0);
  sVar5 = (short)sibling_level;
  if (sibling_level == -1) {
    sVar5 = (short)seq;
  }
  StreamWriter<false,_false>::Put<short>(this_00,sVar5);
  anon_unknown_0::ChunkWriter::~ChunkWriter(&local_90);
  anon_unknown_0::ChunkWriter::~ChunkWriter((ChunkWriter *)&local_70);
  local_7c = seq + 1;
  local_80 = local_7c;
  if (node->mNumChildren != 0) {
    uVar4 = 0;
    do {
      local_80 = WriteHierarchy(this,node->mChildren[uVar4],local_80,-(uint)(uVar4 == 0) | local_7c)
      ;
      uVar4 = uVar4 + 1;
    } while (uVar4 < node->mNumChildren);
  }
  if (node->mNumMeshes != 0) {
    local_50 = (ulong)local_80;
    uVar4 = 0;
    local_78 = this_00;
    local_48 = node;
    do {
      pSVar3 = local_78;
      uVar1 = node->mNumChildren;
      uVar2 = node->mMeshes[uVar4];
      this_01 = this->scene->mMeshes[(long)(ulong)uVar2];
      local_90.writer = local_78;
      local_90.chunk_start_pos = (this->writer).cursor;
      StreamWriter<false,_false>::Put<unsigned_short>(local_78,0xb002);
      StreamWriter<false,_false>::Put<unsigned_int>(pSVar3,0xdeadbeef);
      local_40.writer = pSVar3;
      local_40.chunk_start_pos = (this->writer).cursor;
      StreamWriter<false,_false>::Put<unsigned_short>(pSVar3,0xb010);
      StreamWriter<false,_false>::Put<unsigned_int>(pSVar3,0xdeadbeef);
      node = local_48;
      (anonymous_namespace)::GetMeshName_abi_cxx11_
                (&local_70,(_anonymous_namespace_ *)this_01,(aiMesh *)(ulong)uVar2,(uint)local_48,
                 in_R8);
      WriteString(this,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      pSVar3 = local_78;
      StreamWriter<false,_false>::Put<int>(local_78,0);
      sVar5 = (short)local_50 + (short)uVar4;
      if (uVar1 != 0 || (int)uVar4 != 0) {
        sVar5 = (short)local_7c;
      }
      StreamWriter<false,_false>::Put<short>(pSVar3,sVar5);
      anon_unknown_0::ChunkWriter::~ChunkWriter(&local_40);
      anon_unknown_0::ChunkWriter::~ChunkWriter(&local_90);
      uVar4 = uVar4 + 1;
    } while (uVar4 < node->mNumMeshes);
    local_80 = local_80 + (int)uVar4;
  }
  return local_80;
}

Assistant:

int Discreet3DSExporter::WriteHierarchy(const aiNode& node, int seq, int sibling_level)
{
    // 3DS scene hierarchy is serialized as in http://www.martinreddy.net/gfx/3d/3DS.spec
    {
        ChunkWriter chunk(writer, Discreet3DS::CHUNK_TRACKINFO);
        {
            ChunkWriter chunk(writer, Discreet3DS::CHUNK_TRACKOBJNAME);

            // Assimp node names are unique and distinct from all mesh-node
            // names we generate; thus we can use them as-is
            WriteString(node.mName);

            // Two unknown int16 values - it is even unclear if 0 is a safe value
            // but luckily importers do not know better either.
            writer.PutI4(0);

            int16_t hierarchy_pos = static_cast<int16_t>(seq);
            if (sibling_level != -1) {
                hierarchy_pos = sibling_level;
            }

            // Write the hierarchy position
            writer.PutI2(hierarchy_pos);
        }
    }

    // TODO: write transformation chunks

    ++seq;
    sibling_level = seq;

    // Write all children
    for (unsigned int i = 0; i < node.mNumChildren; ++i) {
        seq = WriteHierarchy(*node.mChildren[i], seq, i == 0 ? -1 : sibling_level);
    }

    // Write all meshes as separate nodes to be able to reference the meshes by name
    for (unsigned int i = 0; i < node.mNumMeshes; ++i) {
        const bool first_child = node.mNumChildren == 0 && i == 0;

        const unsigned int mesh_idx = node.mMeshes[i];
        const aiMesh& mesh = *scene->mMeshes[mesh_idx];

        ChunkWriter chunk(writer, Discreet3DS::CHUNK_TRACKINFO);
        {
            ChunkWriter chunk(writer, Discreet3DS::CHUNK_TRACKOBJNAME);
            WriteString(GetMeshName(mesh, mesh_idx, node));

            writer.PutI4(0);
            writer.PutI2(static_cast<int16_t>(first_child ? seq : sibling_level));
            ++seq;
        }
    }
    return seq;
}